

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O2

bool S2::UpdateEndpoint(R1Interval *bound,int end,double value)

{
  VType *pVVar1;
  
  if (end == 0) {
    pVVar1 = (bound->bounds_).c_ + 1;
    if (value < *pVVar1 || value == *pVVar1) {
      if (value < (bound->bounds_).c_[0] || value == (bound->bounds_).c_[0]) {
        return true;
      }
      goto LAB_0022bac9;
    }
  }
  else if ((bound->bounds_).c_[0] <= value) {
    if ((bound->bounds_).c_[1] <= value) {
      return true;
    }
    bound = (R1Interval *)((bound->bounds_).c_ + 1);
LAB_0022bac9:
    *(double *)bound = value;
    return true;
  }
  return false;
}

Assistant:

inline static bool UpdateEndpoint(R1Interval* bound, int end, double value) {
  if (end == 0) {
    if (bound->hi() < value) return false;
    if (bound->lo() < value) bound->set_lo(value);
  } else {
    if (bound->lo() > value) return false;
    if (bound->hi() > value) bound->set_hi(value);
  }
  return true;
}